

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_logspec_dct2(fe_t *fe,mfcc_t *fr_spec,mfcc_t *fr_cep)

{
  powspec_t *mflogspec;
  int local_2c;
  int32 i;
  powspec_t *powspec;
  mfcc_t *fr_cep_local;
  mfcc_t *fr_spec_local;
  fe_t *fe_local;
  
  mflogspec = (powspec_t *)
              __ckd_malloc__((long)fe->mel_fb->num_filters << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                             ,0x2e3);
  for (local_2c = 0; local_2c < fe->mel_fb->num_filters; local_2c = local_2c + 1) {
    mflogspec[local_2c] = (powspec_t)(double)(float)fr_spec[local_2c];
  }
  fe_dct2(fe,mflogspec,fr_cep,0);
  ckd_free(mflogspec);
  return 0;
}

Assistant:

int32
fe_logspec_dct2(fe_t * fe, const mfcc_t * fr_spec, mfcc_t * fr_cep)
{
#ifdef FIXED_POINT
    fe_dct2(fe, fr_spec, fr_cep, 0);
#else                           /* ! FIXED_POINT */
    powspec_t *powspec;
    int32 i;

    powspec = ckd_malloc(fe->mel_fb->num_filters * sizeof(powspec_t));
    for (i = 0; i < fe->mel_fb->num_filters; ++i)
        powspec[i] = (powspec_t) fr_spec[i];
    fe_dct2(fe, powspec, fr_cep, 0);
    ckd_free(powspec);
#endif                          /* ! FIXED_POINT */
    return 0;
}